

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

void __thiscall cmCursesMainForm::RePost(cmCursesMainForm *this)

{
  ulong uVar1;
  FORM *form;
  cmState *pcVar2;
  bool bVar3;
  size_t sVar4;
  FIELD **ppFVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  pointer ppcVar9;
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *pvVar10;
  long lVar11;
  allocator local_81;
  string local_80;
  string local_60;
  ulong local_40;
  size_t *local_38;
  
  form = (this->super_cmCursesForm).Form;
  if (form != (FORM *)0x0) {
    unpost_form((FORM_conflict *)form);
    free_form((FORM_conflict *)(this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  if (this->Fields != (FIELD **)0x0) {
    operator_delete__(this->Fields);
  }
  if (this->AdvancedMode == true) {
    pvVar10 = this->Entries;
    sVar4 = (long)(pvVar10->
                  super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar10->
                  super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3;
    this->NumberOfVisibleEntries = sVar4;
LAB_00220579:
    if (sVar4 == 0) goto LAB_002205ba;
    uVar1 = sVar4 * 3 + 1;
    ppFVar5 = (FIELD **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    this->Fields = ppFVar5;
    lVar11 = sVar4 * 3 + 1;
    if (lVar11 != 0) goto LAB_002205d9;
  }
  else {
    this->NumberOfVisibleEntries = 0;
    ppcVar9 = (this->Entries->
              super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (ppcVar9 !=
        (this->Entries->
        super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        pcVar2 = this->CMakeInstance->State;
        pcVar7 = cmCursesCacheEntryComposite::GetValue(*ppcVar9);
        std::__cxx11::string::string((string *)&local_80,pcVar7,(allocator *)&local_60);
        pcVar7 = cmState::GetCacheEntryValue(pcVar2,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        pcVar2 = this->CMakeInstance->State;
        pcVar8 = cmCursesCacheEntryComposite::GetValue(*ppcVar9);
        std::__cxx11::string::string((string *)&local_80,pcVar8,&local_81);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"ADVANCED","");
        bVar3 = cmState::GetCacheEntryPropertyAsBool(pcVar2,&local_80,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((pcVar7 != (char *)0x0) && ((!bVar3 || (this->AdvancedMode != false)))) {
          this->NumberOfVisibleEntries = this->NumberOfVisibleEntries + 1;
        }
        ppcVar9 = ppcVar9 + 1;
        pvVar10 = this->Entries;
      } while (ppcVar9 !=
               (pvVar10->
               super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
               )._M_impl.super__Vector_impl_data._M_finish);
      sVar4 = this->NumberOfVisibleEntries;
      goto LAB_00220579;
    }
LAB_002205ba:
    this->NumberOfVisibleEntries = 1;
    ppFVar5 = (FIELD **)operator_new__(0x20);
    this->Fields = ppFVar5;
    lVar11 = 4;
LAB_002205d9:
    lVar6 = 0;
    do {
      this->Fields[lVar6] = (FIELD *)0x0;
      lVar6 = lVar6 + 1;
    } while (lVar11 != lVar6);
    pvVar10 = this->Entries;
  }
  local_38 = &this->NumberOfVisibleEntries;
  ppcVar9 = (pvVar10->
            super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar9 ==
      (pvVar10->
      super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    ppFVar5 = this->Fields;
  }
  else {
    local_40 = 0;
    do {
      pcVar2 = this->CMakeInstance->State;
      pcVar7 = cmCursesCacheEntryComposite::GetValue(*ppcVar9);
      std::__cxx11::string::string((string *)&local_80,pcVar7,(allocator *)&local_60);
      pcVar7 = cmState::GetCacheEntryValue(pcVar2,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = this->CMakeInstance->State;
      pcVar8 = cmCursesCacheEntryComposite::GetValue(*ppcVar9);
      std::__cxx11::string::string((string *)&local_80,pcVar8,&local_81);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"ADVANCED","");
      bVar3 = cmState::GetCacheEntryPropertyAsBool(pcVar2,&local_80,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((pcVar7 != (char *)0x0) && ((!bVar3 || (this->AdvancedMode != false)))) {
        lVar11 = (long)((int)local_40 * 3);
        this->Fields[lVar11] = ((*ppcVar9)->Label->super_cmCursesWidget).Field;
        this->Fields[lVar11 + 1] = ((*ppcVar9)->IsNewLabel->super_cmCursesWidget).Field;
        this->Fields[lVar11 + 2] = (*ppcVar9)->Entry->Field;
        local_40 = (ulong)((int)local_40 + 1);
      }
      ppcVar9 = ppcVar9 + 1;
      pvVar10 = this->Entries;
    } while (ppcVar9 !=
             (pvVar10->
             super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    ppFVar5 = this->Fields;
    if ((int)local_40 != 0) {
      lVar11 = *local_38 * 0x18;
      goto LAB_002207da;
    }
  }
  ppcVar9 = (pvVar10->
            super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  *ppFVar5 = ((*ppcVar9)->Label->super_cmCursesWidget).Field;
  this->Fields[1] = ((*ppcVar9)->IsNewLabel->super_cmCursesWidget).Field;
  this->Fields[2] = (*ppcVar9)->Entry->Field;
  this->NumberOfVisibleEntries = 1;
  ppFVar5 = this->Fields;
  lVar11 = 0x18;
LAB_002207da:
  *(undefined8 *)((long)ppFVar5 + lVar11) = 0;
  return;
}

Assistant:

void cmCursesMainForm::RePost()
{
  // Create the fields to be passed to the form.
  if (this->Form)
    {
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = 0;
    }
  delete[] this->Fields;
  if (this->AdvancedMode)
    {
    this->NumberOfVisibleEntries = this->Entries->size();
    }
  else
    {
    // If normal mode, count only non-advanced entries
    this->NumberOfVisibleEntries = 0;
    std::vector<cmCursesCacheEntryComposite*>::iterator it;
    for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
      {
      const char* existingValue =
          this->CMakeInstance->GetState()
              ->GetCacheEntryValue((*it)->GetValue());
      bool advanced =
          this->CMakeInstance->GetState()
              ->GetCacheEntryPropertyAsBool((*it)->GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced))
        {
        continue;
        }
      this->NumberOfVisibleEntries++;
      }
    }
  // there is always one even if it is the dummy one
  if(this->NumberOfVisibleEntries == 0)
    {
    this->NumberOfVisibleEntries = 1;
    }
  // Assign the fields: 3 for each entry: label, new entry marker
  // ('*' or ' ') and entry widget
  this->Fields = new FIELD*[3*this->NumberOfVisibleEntries+1];
  size_t cc;
  for ( cc = 0; cc < 3 * this->NumberOfVisibleEntries+1; cc ++ )
    {
    this->Fields[cc] = 0;
    }

  // Assign fields
  int j=0;
  std::vector<cmCursesCacheEntryComposite*>::iterator it;
  for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
    {
    const char* existingValue =
        this->CMakeInstance->GetState()
            ->GetCacheEntryValue((*it)->GetValue());
    bool advanced =
        this->CMakeInstance->GetState()
            ->GetCacheEntryPropertyAsBool((*it)->GetValue(), "ADVANCED");
    if (!existingValue || (!this->AdvancedMode && advanced))
      {
      continue;
      }
    this->Fields[3*j]    = (*it)->Label->Field;
    this->Fields[3*j+1]  = (*it)->IsNewLabel->Field;
    this->Fields[3*j+2]  = (*it)->Entry->Field;
    j++;
    }
  // if no cache entries there should still be one dummy field
  if(j == 0)
    {
    it = this->Entries->begin();
    this->Fields[0]    = (*it)->Label->Field;
    this->Fields[1]  = (*it)->IsNewLabel->Field;
    this->Fields[2]  = (*it)->Entry->Field;
    this->NumberOfVisibleEntries = 1;
    }
  // Has to be null terminated.
  this->Fields[3*this->NumberOfVisibleEntries] = 0;
}